

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool disconnect_if_dead(connectdata *conn,Curl_easy *data)

{
  int iVar1;
  _Bool _Var2;
  
  if (((conn->send_pipe).size + (conn->recv_pipe).size == 0) && (conn->inuse == false)) {
    if (((conn->handler->protocol & 0x40000) == 0) &&
       (iVar1 = Curl_socket_check(conn->sock[0],-1,-1,0), iVar1 == 0)) {
      return false;
    }
    conn->data = data;
    Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
    Curl_disconnect(conn,true);
    _Var2 = true;
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool disconnect_if_dead(struct connectdata *conn,
                               struct Curl_easy *data)
{
  size_t pipeLen = conn->send_pipe.size + conn->recv_pipe.size;
  if(!pipeLen && !conn->inuse) {
    /* The check for a dead socket makes sense only if there are no
       handles in pipeline and the connection isn't already marked in
       use */
    bool dead;
    if(conn->handler->protocol & CURLPROTO_RTSP)
      /* RTSP is a special case due to RTP interleaving */
      dead = Curl_rtsp_connisdead(conn);
    else
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);

    if(dead) {
      conn->data = data;
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);

      /* disconnect resources */
      Curl_disconnect(conn, /* dead_connection */TRUE);
      return TRUE;
    }
  }
  return FALSE;
}